

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

int __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
computeApproxMemUsage(GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *this)

{
  _Rb_tree_node_base *p_Var1;
  pointer pSVar2;
  int iVar3;
  
  iVar3 = 0;
  for (p_Var1 = (this->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    iVar3 = iVar3 + *(int *)(*(long *)(p_Var1 + 2) + 4);
  }
  for (pSVar2 = (this->m_garbageObjects).
                super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar2 != (this->m_garbageObjects).
                super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    iVar3 = iVar3 + pSVar2->m_ptr->m_dataSizeApprox;
  }
  return iVar3;
}

Assistant:

int GLObjectManager<T>::computeApproxMemUsage (void) const
{
	int result = 0;

	for (typename map<string, SharedPtr<T> >::const_iterator it = m_objects.begin(); it != m_objects.end(); ++it)
		result += it->second->getApproxMemUsage();

	for (typename vector<SharedPtr<T> >::const_iterator it = m_garbageObjects.begin(); it != m_garbageObjects.end(); ++it)
		result += (*it)->getApproxMemUsage();

	return result;
}